

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgap_dictionary.h
# Opt level: O1

void __thiscall
bwtil::cgap_dictionary::cgap_dictionary
          (cgap_dictionary *this,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *gaps)

{
  pointer *pppVar1;
  _Rb_tree_header *p_Var2;
  vector<bool,_std::allocator<bool>_> *pvVar3;
  double dVar4;
  iterator __position;
  pointer ppVar5;
  void *pvVar6;
  pointer puVar7;
  size_t sVar8;
  ulong *puVar9;
  pointer ptVar10;
  pointer ptVar11;
  bool bVar12;
  uint8_t uVar13;
  pointer pvVar14;
  undefined1 (*pauVar15) [64];
  double *pdVar16;
  mapped_type *this_00;
  ulong *puVar17;
  ulong uVar18;
  ulint i;
  ulong uVar19;
  long lVar20;
  uint *puVar21;
  pointer ppVar22;
  byte bVar23;
  pointer ppVar24;
  size_t sVar25;
  unsigned_long *puVar26;
  ulong uVar27;
  size_t begin;
  long lVar28;
  int iVar29;
  ulong uVar30;
  char cVar31;
  char cVar32;
  uint uVar33;
  byte bVar34;
  pointer pvVar35;
  iterator __end2;
  iterator __begin2;
  size_t sVar36;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar38 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar48 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar51 [16];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range2;
  HuffmanTree<unsigned_long> ht;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  vector<bool,_std::allocator<bool>_> c;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_128;
  HuffmanTree<unsigned_long> local_108;
  double local_c8;
  packed_view<std::vector> *local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>
  *local_98;
  map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  *local_90;
  undefined1 local_88 [16];
  pointer local_78;
  uint local_70;
  _Bit_pointer local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_48;
  
  auVar39 = in_ZMM7._0_16_;
  local_c0 = &this->H_len;
  local_98 = (vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>
              *)&this->H_long;
  local_90 = &this->encoding;
  p_Var2 = &(this->encoding)._M_t._M_impl.super__Rb_tree_header;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->H_val)._size = 0;
  (this->H_val)._width = 0;
  (this->H_val)._field_mask = 0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->H_len)._size = 0;
  (this->H_len)._width = 0;
  (this->H_len)._field_mask = 0;
  (this->H_long).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->H_long).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_long).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->prefix_length = '\0';
  this->log2_max_gap = 0;
  ppVar22 = (gaps->
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (gaps->
       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)__position._M_current - (long)ppVar22 == 0x10) {
    local_108.sigma_0 = ppVar22->first + 1;
    local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    if (__position._M_current ==
        (gaps->
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
      in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
      ::std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)gaps,__position,(pair<unsigned_long,_unsigned_long> *)&local_108);
    }
    else {
      (__position._M_current)->first = local_108.sigma_0;
      (__position._M_current)->second = 1;
      pppVar1 = &(gaps->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
  }
  ppVar22 = (gaps->
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (gaps->
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar22 == ppVar5) {
    local_c8 = 0.0;
    lVar20 = 0;
  }
  else {
    auVar41 = vpbroadcastq_avx512f();
    auVar41 = vpsrlq_avx512f(auVar41,4);
    auVar49 = ZEXT1664((undefined1  [16])0x0);
    uVar19 = 0;
    auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar40 = vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    in_ZMM4 = ZEXT3264(auVar40);
    auVar50 = ZEXT1664((undefined1  [16])0x0);
    ppVar24 = ppVar22;
    do {
      auVar43 = vmovdqa64_avx512f(auVar50);
      auVar44 = vmovdqa64_avx512f(auVar49);
      auVar49 = vpbroadcastq_avx512f();
      auVar49 = vporq_avx512f(auVar49,auVar42);
      uVar27 = vpcmpuq_avx512f(auVar49,auVar41,2);
      auVar49 = vpgatherdq_avx512f((int)ppVar24->first);
      bVar34 = (byte)uVar27;
      auVar50._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar49._8_8_;
      auVar50._0_8_ = (ulong)(bVar34 & 1) * auVar49._0_8_;
      auVar50._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar49._16_8_;
      auVar50._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar49._24_8_;
      auVar50._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar49._32_8_;
      auVar50._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar49._40_8_;
      auVar50._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar49._48_8_;
      auVar50._56_8_ = (uVar27 >> 7) * auVar49._56_8_;
      auVar49 = vpgatherdq_avx512f((int)ppVar24->second);
      auVar45._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar49._8_8_;
      auVar45._0_8_ = (ulong)(bVar34 & 1) * auVar49._0_8_;
      auVar45._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar49._16_8_;
      auVar45._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar49._24_8_;
      auVar45._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar49._32_8_;
      auVar45._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar49._40_8_;
      auVar45._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar49._48_8_;
      auVar45._56_8_ = (uVar27 >> 7) * auVar49._56_8_;
      auVar49 = vpaddq_avx512f(auVar45,auVar44);
      auVar50 = vpmaxuq_avx512f(auVar50,auVar43);
      uVar19 = uVar19 + 8;
      ppVar24 = ppVar24 + 8;
    } while ((((ulong)((long)ppVar5 + (-0x10 - (long)ppVar22)) >> 4) + 8 & 0xfffffffffffffff8) !=
             uVar19);
    auVar41 = vmovdqa64_avx512f(auVar50);
    auVar42._0_8_ = (ulong)(bVar34 & 1) * auVar41._0_8_ | (ulong)!(bool)(bVar34 & 1) * auVar43._0_8_
    ;
    bVar12 = (bool)((byte)(uVar27 >> 1) & 1);
    auVar42._8_8_ = (ulong)bVar12 * auVar41._8_8_ | (ulong)!bVar12 * auVar43._8_8_;
    bVar12 = (bool)((byte)(uVar27 >> 2) & 1);
    auVar42._16_8_ = (ulong)bVar12 * auVar41._16_8_ | (ulong)!bVar12 * auVar43._16_8_;
    bVar12 = (bool)((byte)(uVar27 >> 3) & 1);
    auVar42._24_8_ = (ulong)bVar12 * auVar41._24_8_ | (ulong)!bVar12 * auVar43._24_8_;
    bVar12 = (bool)((byte)(uVar27 >> 4) & 1);
    auVar42._32_8_ = (ulong)bVar12 * auVar41._32_8_ | (ulong)!bVar12 * auVar43._32_8_;
    bVar12 = (bool)((byte)(uVar27 >> 5) & 1);
    auVar42._40_8_ = (ulong)bVar12 * auVar41._40_8_ | (ulong)!bVar12 * auVar43._40_8_;
    bVar12 = (bool)((byte)(uVar27 >> 6) & 1);
    auVar42._48_8_ = (ulong)bVar12 * auVar41._48_8_ | (ulong)!bVar12 * auVar43._48_8_;
    auVar42._56_8_ = (uVar27 >> 7) * auVar41._56_8_ | (ulong)!SUB81(uVar27 >> 7,0) * auVar43._56_8_;
    auVar41 = vmovdqa64_avx512f(auVar49);
    in_ZMM3._0_8_ = (ulong)(bVar34 & 1) * auVar41._0_8_ | (ulong)!(bool)(bVar34 & 1) * auVar44._0_8_
    ;
    bVar12 = (bool)((byte)(uVar27 >> 1) & 1);
    in_ZMM3._8_8_ = (ulong)bVar12 * auVar41._8_8_ | (ulong)!bVar12 * auVar44._8_8_;
    bVar12 = (bool)((byte)(uVar27 >> 2) & 1);
    in_ZMM3._16_8_ = (ulong)bVar12 * auVar41._16_8_ | (ulong)!bVar12 * auVar44._16_8_;
    bVar12 = (bool)((byte)(uVar27 >> 3) & 1);
    in_ZMM3._24_8_ = (ulong)bVar12 * auVar41._24_8_ | (ulong)!bVar12 * auVar44._24_8_;
    bVar12 = (bool)((byte)(uVar27 >> 4) & 1);
    in_ZMM3._32_8_ = (ulong)bVar12 * auVar41._32_8_ | (ulong)!bVar12 * auVar44._32_8_;
    bVar12 = (bool)((byte)(uVar27 >> 5) & 1);
    in_ZMM3._40_8_ = (ulong)bVar12 * auVar41._40_8_ | (ulong)!bVar12 * auVar44._40_8_;
    bVar12 = (bool)((byte)(uVar27 >> 6) & 1);
    in_ZMM3._48_8_ = (ulong)bVar12 * auVar41._48_8_ | (ulong)!bVar12 * auVar44._48_8_;
    in_ZMM3._56_8_ = (uVar27 >> 7) * auVar41._56_8_ | (ulong)!SUB81(uVar27 >> 7,0) * auVar44._56_8_;
    auVar40 = vextracti64x4_avx512f(in_ZMM3,1);
    auVar41 = vpaddq_avx512f(in_ZMM3,ZEXT3264(auVar40));
    auVar48 = vpaddq_avx(auVar41._0_16_,auVar41._16_16_);
    auVar38 = vpshufd_avx(auVar48,0xee);
    auVar48 = vpaddq_avx(auVar48,auVar38);
    auVar40 = vextracti64x4_avx512f(auVar42,1);
    auVar41 = vpmaxuq_avx512f(auVar42,ZEXT3264(auVar40));
    auVar37 = vpmaxuq_avx512vl(auVar41._0_16_,auVar41._16_16_);
    auVar38 = vpshufd_avx(auVar37,0xee);
    auVar38 = vpmaxuq_avx512vl(auVar37,auVar38);
    lVar20 = auVar38._0_8_;
    auVar39 = vcvtusi2sd_avx512f(auVar39,auVar48._0_8_);
    local_c8 = auVar39._0_8_;
  }
  auVar48 = in_ZMM4._0_16_;
  auVar39 = in_ZMM3._0_16_;
  bVar23 = 0x40 - (char)LZCOUNT(lVar20);
  bVar34 = 1;
  if (1 < bVar23) {
    bVar34 = bVar23;
  }
  uVar19 = 1;
  if (lVar20 != 0) {
    uVar19 = (ulong)bVar34;
  }
  this->log2_max_gap = uVar19;
  local_128.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  if (ppVar22 != ppVar5) {
    do {
      local_108._0_16_ = *ppVar22;
      if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
        in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                   (iterator)
                   local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)((long)&local_108 + 8)
                  );
      }
      else {
        *local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = ppVar22->second;
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      auVar48 = in_ZMM4._0_16_;
      auVar39 = in_ZMM3._0_16_;
      ppVar22 = ppVar22 + 1;
    } while (ppVar22 != ppVar5);
  }
  auVar41 = ZEXT1664(auVar39);
  auVar42 = ZEXT1664(auVar48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_60,&local_b8);
  HuffmanTree<unsigned_long>::HuffmanTree(&local_108,&local_60);
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(&local_48,
           (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)((long)&local_108 + 0x20));
  local_78 = local_128.
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._8_8_ =
       local_128.
       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88._0_8_ =
       local_128.
       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_128.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_128.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_128.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)local_88);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_48);
  pvVar14 = local_128.
            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar35 = local_128.
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_88,pvVar35);
      if ((pointer)local_88._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_88._0_8_);
        local_88._0_8_ = (pointer)0x0;
        local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
        local_78 = (pointer)0x0;
        local_70 = 0;
        local_68 = (_Bit_pointer)0x0;
      }
      pvVar35 = pvVar35 + 1;
    } while (pvVar35 != pvVar14);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)((long)&local_108 + 0x20));
  if (local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.frequencies.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pauVar15 = (undefined1 (*) [64])operator_new(0x200);
  pvVar14 = local_128.
            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  auVar39 = auVar42._0_16_;
  auVar49 = ZEXT864(0) << 0x40;
  pauVar15[7] = auVar49;
  pauVar15[6] = auVar49;
  pauVar15[5] = auVar49;
  pauVar15[4] = auVar49;
  pauVar15[3] = auVar49;
  pauVar15[2] = auVar49;
  pauVar15[1] = auVar49;
  *pauVar15 = auVar49;
  if (local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar35 = local_128.
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      auVar41 = ZEXT1664(auVar41._0_16_);
      auVar42 = ZEXT1664(auVar42._0_16_);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_108,pvVar35);
      lVar20 = ((long)local_108.frequencies.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - local_108.sigma_0) * 8 +
               (ulong)(uint)local_108.frequencies.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
      auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar41 = vpternlogd_avx512f(auVar41,auVar41,auVar41,0xff);
      if (lVar20 != 0) {
        auVar50 = vpbroadcastq_avx512f();
        uVar19 = 0;
        do {
          auVar43 = vpbroadcastq_avx512f();
          auVar43 = vporq_avx512f(auVar43,auVar49);
          uVar27 = vpcmpuq_avx512f(auVar43,auVar50,2);
          auVar43 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)*pauVar15 + uVar19 * 8));
          auVar44._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar43._8_8_;
          auVar44._0_8_ = (ulong)((byte)uVar27 & 1) * auVar43._0_8_;
          auVar44._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar43._16_8_;
          auVar44._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * auVar43._24_8_;
          auVar44._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * auVar43._32_8_;
          auVar44._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * auVar43._40_8_;
          auVar44._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * auVar43._48_8_;
          auVar44._56_8_ = (uVar27 >> 7) * auVar43._56_8_;
          auVar43 = vpsubq_avx512f(auVar44,auVar41);
          auVar43 = vmovdqu64_avx512f(auVar43);
          *(undefined1 (*) [64])((long)*pauVar15 + uVar19 * 8) = auVar43;
          uVar19 = uVar19 + 8;
        } while ((lVar20 + 7U & 0xfffffffffffffff8) != uVar19);
      }
      if ((_Bit_type *)local_108.sigma_0 != (_Bit_type *)0x0) {
        auVar41 = ZEXT1664(auVar41._0_16_);
        auVar42 = ZEXT1664(auVar42._0_16_);
        operator_delete((void *)local_108.sigma_0);
        local_108._0_12_ = ZEXT812(0);
        local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        local_108.codes.
        super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
      auVar39 = auVar42._0_16_;
      pvVar35 = pvVar35 + 1;
    } while (pvVar35 != pvVar14);
  }
  pdVar16 = (double *)operator_new(0x200);
  pdVar16[0x38] = 0.0;
  pdVar16[0x39] = 0.0;
  pdVar16[0x3a] = 0.0;
  pdVar16[0x3b] = 0.0;
  pdVar16[0x3c] = 0.0;
  pdVar16[0x3d] = 0.0;
  pdVar16[0x3e] = 0.0;
  pdVar16[0x3f] = 0.0;
  pdVar16[0x30] = 0.0;
  pdVar16[0x31] = 0.0;
  pdVar16[0x32] = 0.0;
  pdVar16[0x33] = 0.0;
  pdVar16[0x34] = 0.0;
  pdVar16[0x35] = 0.0;
  pdVar16[0x36] = 0.0;
  pdVar16[0x37] = 0.0;
  pdVar16[0x28] = 0.0;
  pdVar16[0x29] = 0.0;
  pdVar16[0x2a] = 0.0;
  pdVar16[0x2b] = 0.0;
  pdVar16[0x2c] = 0.0;
  pdVar16[0x2d] = 0.0;
  pdVar16[0x2e] = 0.0;
  pdVar16[0x2f] = 0.0;
  pdVar16[0x20] = 0.0;
  pdVar16[0x21] = 0.0;
  pdVar16[0x22] = 0.0;
  pdVar16[0x23] = 0.0;
  pdVar16[0x24] = 0.0;
  pdVar16[0x25] = 0.0;
  pdVar16[0x26] = 0.0;
  pdVar16[0x27] = 0.0;
  pdVar16[0x18] = 0.0;
  pdVar16[0x19] = 0.0;
  pdVar16[0x1a] = 0.0;
  pdVar16[0x1b] = 0.0;
  pdVar16[0x1c] = 0.0;
  pdVar16[0x1d] = 0.0;
  pdVar16[0x1e] = 0.0;
  pdVar16[0x1f] = 0.0;
  pdVar16[0x10] = 0.0;
  pdVar16[0x11] = 0.0;
  pdVar16[0x12] = 0.0;
  pdVar16[0x13] = 0.0;
  pdVar16[0x14] = 0.0;
  pdVar16[0x15] = 0.0;
  pdVar16[0x16] = 0.0;
  pdVar16[0x17] = 0.0;
  pdVar16[8] = 0.0;
  pdVar16[9] = 0.0;
  pdVar16[10] = 0.0;
  pdVar16[0xb] = 0.0;
  pdVar16[0xc] = 0.0;
  pdVar16[0xd] = 0.0;
  pdVar16[0xe] = 0.0;
  pdVar16[0xf] = 0.0;
  *pdVar16 = 0.0;
  pdVar16[1] = 0.0;
  pdVar16[2] = 0.0;
  pdVar16[3] = 0.0;
  pdVar16[4] = 0.0;
  pdVar16[5] = 0.0;
  pdVar16[6] = 0.0;
  pdVar16[7] = 0.0;
  if ((long)local_128.
            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_128.
            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar20 = ((long)local_128.
                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_128.
                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    lVar20 = lVar20 + (ulong)(lVar20 == 0);
    puVar21 = &((local_128.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_offset;
    puVar26 = &((gaps->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->second;
    do {
      auVar48 = vcvtusi2sd_avx512f(auVar39,*puVar26);
      lVar28 = (long)((_Bit_iterator_base *)(puVar21 + -2))->_M_p - *(long *)(puVar21 + -6);
      pdVar16[lVar28 * 8 + (ulong)*puVar21] = auVar48._0_8_ + pdVar16[lVar28 * 8 + (ulong)*puVar21];
      puVar21 = puVar21 + 10;
      puVar26 = puVar26 + 2;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
  }
  dVar4 = *pdVar16;
  lVar20 = 1;
  do {
    dVar4 = dVar4 + pdVar16[lVar20];
    pdVar16[lVar20] = dVar4;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x40);
  auVar39._0_8_ = 1.0 / local_c8;
  auVar39._8_8_ = 0;
  auVar41 = vbroadcastsd_avx512f(auVar39);
  lVar20 = 0;
  auVar42 = vbroadcastsd_avx512f(ZEXT816(0x4059000000000000));
  do {
    auVar49 = vmulpd_avx512f(auVar42,*(undefined1 (*) [64])(pdVar16 + lVar20));
    auVar49 = vmulpd_avx512f(auVar49,auVar41);
    *(undefined1 (*) [64])(pdVar16 + lVar20) = auVar49;
    lVar20 = lVar20 + 8;
  } while (lVar20 != 0x40);
  this->prefix_length = '\x01';
  uVar27 = 1;
  uVar19 = 0x8000000000000000;
  do {
    bVar34 = 0x40 - (char)LZCOUNT(uVar27);
    uVar33 = (uint)bVar34;
    if (bVar34 < 2) {
      uVar33 = 1;
    }
    uVar30 = *(long *)((long)*pauVar15 + uVar27 * 8) * 0xc0 +
             ((ulong)uVar33 + this->log2_max_gap << (uVar27 & 0x3f));
    if (uVar30 < uVar19) {
      this->prefix_length = (uint8_t)uVar27;
      uVar19 = uVar30;
    }
    uVar27 = uVar27 + 1;
  } while (uVar27 != 0x1e);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = this->log2_max_gap;
  auVar41 = vpbroadcastq_avx512f(auVar48);
  auVar42 = vpbroadcastq_avx512f();
  auVar49 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
  lVar20 = 0;
  auVar50 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar43 = vpbroadcastq_avx512f(ZEXT816(0x1d));
  auVar38[8] = 0x40;
  auVar38._0_8_ = 0x4040404040404040;
  auVar38[9] = 0x40;
  auVar38[10] = 0x40;
  auVar38[0xb] = 0x40;
  auVar38[0xc] = 0x40;
  auVar38[0xd] = 0x40;
  auVar38[0xe] = 0x40;
  auVar38[0xf] = 0x40;
  auVar37[8] = 1;
  auVar37._0_8_ = 0x101010101010101;
  auVar37[9] = 1;
  auVar37[10] = 1;
  auVar37[0xb] = 1;
  auVar37[0xc] = 1;
  auVar37[0xd] = 1;
  auVar37[0xe] = 1;
  auVar37[0xf] = 1;
  auVar44 = vpbroadcastq_avx512f(ZEXT816(0xc0));
  auVar45 = vpbroadcastq_avx512f(ZEXT816(8));
  do {
    auVar46 = vpbroadcastq_avx512f();
    auVar46 = vporq_avx512f(auVar46,auVar50);
    uVar19 = vpcmpuq_avx512f(auVar46,auVar43,1);
    auVar47 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)*pauVar15 + lVar20 * 8 + 8));
    auVar46._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar47._8_8_;
    auVar46._0_8_ = (ulong)((byte)uVar19 & 1) * auVar47._0_8_;
    auVar46._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar47._16_8_;
    auVar46._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar47._24_8_;
    auVar46._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar47._32_8_;
    auVar46._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar47._40_8_;
    auVar46._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar47._48_8_;
    auVar46._56_8_ = (uVar19 >> 7) * auVar47._56_8_;
    auVar46 = vpmullq_avx512dq(auVar46,auVar44);
    auVar47 = vplzcntq_avx512cd(auVar49);
    auVar39 = vpmovqb_avx512f(auVar47);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auVar39._0_8_;
    auVar39 = vpsubb_avx(auVar38,auVar51);
    auVar39 = vpmaxub_avx(auVar39,auVar37);
    auVar47 = vpmovzxbq_avx512f(auVar39);
    auVar47 = vpaddq_avx512f(auVar41,auVar47);
    auVar47 = vpsllvq_avx512f(auVar47,auVar49);
    auVar46 = vpaddq_avx512f(auVar47,auVar46);
    uVar27 = vpcmpuq_avx512f(auVar46,auVar42,2);
    uVar19 = uVar19 & uVar27;
    uVar27 = uVar19 >> 7 & 1;
    if ((((((uVar19 & 1) != 0) || ((uVar19 >> 1 & 1) != 0)) || ((uVar19 >> 2 & 1) != 0)) ||
        (((uVar19 >> 3 & 1) != 0 || ((uVar19 >> 4 & 1) != 0)))) ||
       (((uVar19 >> 5 & 1) != 0 || (((uVar19 >> 6 & 1) != 0 || ((char)uVar27 != '\0')))))) {
      cVar31 = '\x03';
      if ((uVar19 >> 2 & 1) == 0) {
        cVar31 = ((byte)(uVar19 >> 1) & 1) + 1;
      }
      cVar32 = '\x04';
      if ((uVar19 >> 3 & 1) == 0) {
        cVar32 = cVar31;
      }
      cVar31 = '\x05';
      if ((uVar19 >> 4 & 1) == 0) {
        cVar31 = cVar32;
      }
      cVar32 = '\x06';
      if ((uVar19 >> 5 & 1) == 0) {
        cVar32 = cVar31;
      }
      cVar31 = '\a';
      if ((uVar19 >> 6 & 1) == 0) {
        cVar31 = cVar32;
      }
      uVar13 = (char)lVar20 + '\b';
      if (uVar27 == 0) {
        uVar13 = cVar31 + (char)lVar20;
      }
      this->prefix_length = uVar13;
    }
    lVar20 = lVar20 + 8;
    auVar49 = vpaddq_avx512f(auVar49,auVar45);
  } while (lVar20 != 0x20);
  operator_delete(pdVar16);
  operator_delete(pauVar15);
  if (local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar28 = 0;
    lVar20 = 0;
    uVar19 = 0;
    do {
      pvVar14 = local_128.
                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      this_00 = std::
                map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                ::operator[](local_90,(key_type *)
                                      ((long)&((gaps->
                                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->first +
                                      lVar28));
      std::vector<bool,_std::allocator<bool>_>::operator=
                (this_00,(vector<bool,_std::allocator<bool>_> *)
                         ((long)&(pvVar14->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         lVar20));
      uVar19 = uVar19 + 1;
      lVar20 = lVar20 + 0x28;
      lVar28 = lVar28 + 0x10;
    } while (uVar19 < (ulong)(((long)local_128.
                                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_128.
                                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x3333333333333333));
  }
  sVar36 = 1L << ((ulong)this->prefix_length & 0x3f);
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)&local_108,this->log2_max_gap,sVar36);
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = (this->H_val)._bits._container.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_108.sigma_0;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_108._0_16_ = ZEXT816(0) << 0x20;
  local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6);
  }
  (this->H_val)._field_mask =
       (word_type)
       local_108.codes.
       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->H_val)._size =
       CONCAT44(local_108.frequencies.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_,
                (uint)local_108.frequencies.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  (this->H_val)._width =
       (size_t)local_108.codes.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  if ((_Bit_type *)local_108.sigma_0 != (_Bit_type *)0x0) {
    operator_delete((void *)local_108.sigma_0);
  }
  bVar34 = 8 - (char)LZCOUNT(*(int *)&this->prefix_length << 0x18);
  sVar25 = (size_t)bVar34;
  if (bVar34 < 2) {
    sVar25 = 1;
  }
  if ((char)*(int *)&this->prefix_length == '\0') {
    sVar25 = 1;
  }
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)&local_108,sVar25,sVar36);
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  puVar7 = (this->H_len)._bits._container.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_108.sigma_0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_108._0_16_ = ZEXT816(0) << 0x20;
  local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7);
  }
  (this->H_len)._field_mask =
       (word_type)
       local_108.codes.
       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->H_len)._size =
       CONCAT44(local_108.frequencies.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_,
                (uint)local_108.frequencies.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  (this->H_len)._width =
       (size_t)local_108.codes.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  if ((_Bit_type *)local_108.sigma_0 != (_Bit_type *)0x0) {
    operator_delete((void *)local_108.sigma_0);
  }
  sVar25 = 0;
  while (sVar36 != sVar25) {
    sVar8 = (this->H_len)._width;
    begin = sVar8 * sVar25;
    sVar25 = sVar25 + 1;
    bv::internal::bitview<std::vector>::set(&local_c0->_bits,begin,sVar8 * sVar25,0);
  }
  ppVar22 = (gaps->
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((gaps->
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar22) {
    uVar19 = 0;
    do {
      puVar17 = local_128.
                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar19].
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._M_p;
      puVar9 = local_128.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar19].
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p;
      uVar33 = local_128.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar19].
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_offset;
      uVar27 = (ulong)uVar33 + ((long)puVar9 - (long)puVar17) * 8;
      if (this->prefix_length < uVar27) {
        pvVar3 = local_128.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19;
        uVar30 = 0;
        lVar20 = 0;
        do {
          lVar20 = (ulong)((uint)(puVar17[uVar30 >> 6] >> (uVar30 & 0x3f)) & 1) + lVar20 * 2;
          uVar30 = uVar30 + 1;
        } while ((uVar30 & 0xffffffff) < uVar27);
        local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)(lVar20 << ((ulong)(byte)-(char)uVar27 & 0x3f));
        local_108.sigma_0._0_1_ =
             ((char)*(undefined4 *)
                     &(pvVar3->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
             (char)*(undefined4 *)
                    &(pvVar3->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * '\b' +
             (char)(pvVar3->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
        local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)ppVar22[uVar19].first;
        ::std::
        vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>
        ::emplace_back<std::tuple<unsigned_long,unsigned_long,unsigned_char>>
                  (local_98,(tuple<unsigned_long,_unsigned_long,_unsigned_char> *)&local_108);
      }
      else {
        if (puVar17 == puVar9 && uVar33 == 0) {
          lVar20 = 0;
        }
        else {
          lVar20 = 0;
          uVar30 = 0;
          do {
            lVar20 = (ulong)((uint)(*puVar17 >> (uVar30 & 0x3f)) & 1) + lVar20 * 2;
            iVar29 = (int)uVar30;
            puVar17 = puVar17 + (iVar29 == 0x3f);
            uVar30 = (ulong)(iVar29 + 1);
            if (iVar29 == 0x3f) {
              uVar30 = 0;
            }
          } while ((uint)uVar30 != uVar33 || puVar17 != puVar9);
        }
        local_c8 = (double)(lVar20 << ((ulong)((uint)this->prefix_length - (int)uVar27) & 0x3f));
        uVar30 = 1;
        do {
          lVar20 = (long)local_c8 + uVar30;
          lVar28 = (long)local_c8 + -1 + uVar30;
          sVar36 = (this->H_val)._width;
          bv::internal::bitview<std::vector>::set
                    ((bitview<std::vector> *)this,sVar36 * lVar28,sVar36 * lVar20,
                     (gaps->
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar19].first);
          sVar36 = (this->H_len)._width;
          bv::internal::bitview<std::vector>::set
                    (&local_c0->_bits,lVar28 * sVar36,lVar20 * sVar36,uVar27);
          uVar18 = uVar30 >> ((ulong)(uint)(*(int *)&this->prefix_length - (int)uVar27) & 0x3f);
          uVar30 = uVar30 + 1;
        } while (uVar18 == 0);
      }
      uVar19 = uVar19 + 1;
      ppVar22 = (gaps->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar19 < (ulong)((long)(gaps->
                                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar22 >> 4
                             ));
  }
  ptVar10 = (this->H_long).
            super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ptVar11 = (this->H_long).
            super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar10 != ptVar11) {
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long,unsigned_char>*,std::vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bwtil::cgap_dictionary::cgap_dictionary(std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>)::_lambda(std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::tuple<unsigned_long,unsigned_long,unsigned_char>)_1_>>
              (ptVar10,ptVar11,
               (int)LZCOUNT(((long)ptVar11 - (long)ptVar10 >> 3) * -0x5555555555555555) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long,unsigned_char>*,std::vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bwtil::cgap_dictionary::cgap_dictionary(std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>)::_lambda(std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::tuple<unsigned_long,unsigned_long,unsigned_char>)_1_>>
              (ptVar10,ptVar11);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_128);
  return;
}

Assistant:

cgap_dictionary(vector<pair<ulint,ulint> > gaps){

		assert(gaps.size()>0);

		//if there is only 1 distinct gap, this creates problems with the huffman codes ...
		//in this case, create one fake gap. There will be 2 codes: 0 and 1
		if(gaps.size()==1)
			gaps.push_back({gaps[0].first+1,1});

		//compute u and n
		ulint u=0;
		ulint n=0;

		ulint max_gap=0;

		for(auto g : gaps){

			assert(g.first>0);
			assert(g.second>0);

			u += (g.first*g.second);
			n += g.second;

			if(g.first>max_gap)
				max_gap=g.first;

		}

		log2_max_gap = intlog2(max_gap);

		//build Huffman tree and retrieve boolean codes
		vector<vector<bool> > codes;

		{
			vector<ulint> freqs;

			for(auto g : gaps)
				freqs.push_back(g.second);

			HuffmanTree<ulint> ht(freqs);

			codes = ht.getCodes();

			for(auto c : codes){

				//make sure that no code is longer than 63 bits
				assert(c.size()<sizeof(ulint)*8);

			}

		}

		assert(codes.size()==gaps.size());

		{
			//count long codes
			vector<ulint> long_codes(64,0);
			for(auto c : codes)
				for(ulint i=0;i<c.size();++i)
					long_codes[i]++;

			//just for testing purposes: code_freq[i] contains the cumulative
			//frequency of codes having length <= i
			vector<double> code_freq(64,0);
			for(ulint i=0;i<codes.size();++i)
				code_freq[codes[i].size()]+=gaps[i].second;
			for(ulint i=1;i<code_freq.size();++i)
				code_freq[i] += code_freq[i-1];
			for(ulint i=0;i<code_freq.size();++i)
				code_freq[i] = 100*code_freq[i]/n;

			//compute optimal prefix length for the hash table,
			//i.e. prefix length that minimizes overall size of the dictionary

			prefix_length=1;
			ulint opt_bitsize = ulint(1)<<63;

			//for efficiency reasons, we limit the maximum prefix length to 30 (in order to avoid
			//huge dictionaries)
			for(ulint p=1;p<30;++p){

				//cout << p << " " << code_freq[p] << " " << long_codes[p] << " " << assess_bitsize(p,long_codes[p]) << endl;

				if(assess_bitsize(p,long_codes[p])<opt_bitsize){

					opt_bitsize = assess_bitsize(p,long_codes[p]);
					prefix_length = p;

				}

			}

			//now choose largest prefix that exceeds at most 20% the optimal bitsize
			ulint max_allowed_bitsize = opt_bitsize + (20*opt_bitsize)/100;

			//cout << "opt p = " << (uint)prefix_length << endl;
			//cout << "opt bitsize = " << opt_bitsize << endl;
			//cout << "max bitsize = " << max_allowed_bitsize << endl;

			for(ulint p=1;p<30;++p){

				if(assess_bitsize(p,long_codes[p])<=max_allowed_bitsize)
					prefix_length = p;

			}

			//cout << "optimal prefix_length = " << (ulint)prefix_length<<endl;
			//cout << "with the hash table we catch " << code_freq[prefix_length] << "% of the codes!"<<endl;

		}

		//build the code function
		for(ulint i=0;i<codes.size();++i)
			encoding[gaps[i].first] = codes[i];

		ulint H_size = ulint(1)<<prefix_length;

		H_val = packed_view<vector>(log2_max_gap,H_size);
		H_len = packed_view<vector>(intlog2(prefix_length),H_size);

		for(ulint i=0;i<H_size;++i) H_len[i] = 0;

		//build hash

		//store here triples of the form <code,gap value,code length>
		//where code is the left-shifted Huffman code

		for(ulint i=0;i<gaps.size();++i){

			//code length
			auto l = codes[i].size();
			assert(l>0);

			if(l<=prefix_length){

				//the hash is sufficient to decode this code. Compute H entry
				ulint h = 0;

				for(auto b : codes[i])
					h = h*2+b;

				//shift to left so to occupy exactly prefix_length bits
				h = h << (prefix_length-l);

				//fill all combinations of h followed by any bit sequence (in total prefix_length bits)
				for(ulint j=0;j<(ulint(1)<<(prefix_length-l));++j){
					H_val[h+j] = gaps[i].first;
					H_len[h+j] = l;
				}

			}else{

				//pack the code in a memory word
				ulint h = 0;

				for(uint j=0;j<codes[i].size();++j)
					h = h*2 + codes[i][j];

				//left-shift
				h = h << (sizeof(ulint)*8-codes[i].size());

				H_long.push_back(triple(h,gaps[i].first,(uint8_t)codes[i].size()));

			}

		}

		auto comp = [](triple x, triple y){ return std::get<0>(x) < std::get<0>(y); };
		std::sort(H_long.begin(),H_long.end(),comp);

		assert(log2_max_gap>0);

	}